

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O1

void TestConstExpr::ComparisonTestTU<char,int>(void)

{
  if (ComparisonTestTU<char,int>()::b1 == '\0') {
    ComparisonTestTU<char,int>();
  }
  if (ComparisonTestTU<char,int>()::b2 == '\0') {
    ComparisonTestTU<char,int>();
  }
  if (ComparisonTestTU<char,int>()::b3 == '\0') {
    ComparisonTestTU<char,int>();
  }
  if (ComparisonTestTU<char,int>()::b4 == '\0') {
    ComparisonTestTU<char,int>();
  }
  if (ComparisonTestTU<char,int>()::b5 == '\0') {
    ComparisonTestTU<char,int>();
  }
  if (ComparisonTestTU<char,int>()::b6 == '\0') {
    ComparisonTestTU<char,int>();
  }
  return;
}

Assistant:

void ComparisonTestTU()
	{
		static bool b1 = LessThanTest<T, U>();
		static bool b2 = LessThanEqualTest<T, U>();
		static bool b3 = GreaterThanTest<T, U>();
		static bool b4 = GreaterThanEqualTest<T, U>();
		static bool b5 = EqualTest<T, U>();
		static bool b6 = NotEqualTest<T, U>();
	}